

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_0::getScalarAlignment
                   (uint32_t type_id,ValidationState_t *vstate)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Instruction *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar4;
  const_reference pvVar5;
  uint32_t member_alignment;
  value_type id;
  uint32_t numMembers;
  uint32_t memberIdx;
  uint32_t max_member_alignment;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  value_type compositeMemberTypeId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  Instruction *inst;
  ValidationState_t *vstate_local;
  uint32_t type_id_local;
  
  this = ValidationState_t::FindDef(vstate,type_id);
  this_00 = val::Instruction::words(this);
  OVar2 = val::Instruction::opcode(this);
  if (OVar2 - OpTypeInt < 2) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,2);
    return *pvVar5 >> 3;
  }
  if (1 < OVar2 - OpTypeVector) {
    if (OVar2 - OpTypeImage < 3) {
      bVar1 = ValidationState_t::HasCapability(vstate,BindlessTextureNV);
      if (bVar1) {
        uVar3 = ValidationState_t::samplerimage_variable_address_mode(vstate);
        return uVar3 >> 3;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0xf8,
                    "uint32_t spvtools::val::(anonymous namespace)::getScalarAlignment(uint32_t, ValidationState_t &)"
                   );
    }
    if (1 < OVar2 - OpTypeArray) {
      if (OVar2 == OpTypeStruct) {
        getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&memberIdx,type_id,
                         vstate);
        numMembers = 1;
        id = 0;
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&memberIdx);
        for (; id < (uint)sVar4; id = id + 1) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&memberIdx,
                              (ulong)id);
          uVar3 = getScalarAlignment(*pvVar5,vstate);
          if (numMembers < uVar3) {
            numMembers = uVar3;
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&memberIdx);
        return numMembers;
      }
      if ((OVar2 != OpTypePointer) && (OVar2 != OpTypeUntypedPointerKHR)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x115,
                      "uint32_t spvtools::val::(anonymous namespace)::getScalarAlignment(uint32_t, ValidationState_t &)"
                     );
      }
      uVar3 = ValidationState_t::pointer_size_and_alignment(vstate);
      return uVar3;
    }
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,2);
  members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar5;
  uVar3 = getScalarAlignment(members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,vstate);
  return uVar3;
}

Assistant:

uint32_t getScalarAlignment(uint32_t type_id, ValidationState_t& vstate) {
  const auto inst = vstate.FindDef(type_id);
  const auto& words = inst->words();
  switch (inst->opcode()) {
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
      if (vstate.HasCapability(spv::Capability::BindlessTextureNV))
        return vstate.samplerimage_variable_address_mode() / 8;
      assert(0);
      return 0;
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      return words[2] / 8;
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray: {
      const auto compositeMemberTypeId = words[2];
      return getScalarAlignment(compositeMemberTypeId, vstate);
    }
    case spv::Op::OpTypeStruct: {
      const auto members = getStructMembers(type_id, vstate);
      uint32_t max_member_alignment = 1;
      for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
           memberIdx < numMembers; ++memberIdx) {
        const auto id = members[memberIdx];
        uint32_t member_alignment = getScalarAlignment(id, vstate);
        if (member_alignment > max_member_alignment) {
          max_member_alignment = member_alignment;
        }
      }
      return max_member_alignment;
    } break;
    case spv::Op::OpTypePointer:
    case spv::Op::OpTypeUntypedPointerKHR:
      return vstate.pointer_size_and_alignment();
    default:
      assert(0);
      break;
  }

  return 1;
}